

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O3

void __thiscall getarg_tests::logargs::test_method(logargs *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Logger *pLVar2;
  iterator it;
  size_type sVar3;
  long lVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long *plVar7;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  string str;
  ArgsManager local_args;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  check_type cVar8;
  _Manager_type in_stack_fffffffffffffb88;
  _Invoker_type in_stack_fffffffffffffb90;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 local_398 [16];
  undefined1 *local_388;
  char **local_380;
  assertion_result local_378;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_340;
  undefined8 local_338;
  code *local_330;
  code *local_328;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_320;
  string local_2f8 [32];
  undefined4 local_2d8;
  string local_2d0 [32];
  undefined4 local_2b0;
  string local_2a8 [16];
  long local_298 [2];
  undefined4 local_288;
  ArgsManager local_280;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,"-okaylog-bool",(allocator<char> *)&local_378);
  local_320.second = 1;
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,"-okaylog-negbool",(allocator<char> *)&local_378);
  local_2d8 = 1;
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d0,"-okaylog",(allocator<char> *)&local_378);
  local_2b0 = 1;
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a8,"-dontlog",(allocator<char> *)&local_378);
  local_288 = 0x401;
  __l._M_len = 4;
  __l._M_array = &local_320;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)local_398,__l,(allocator_type *)&local_378);
  SetupArgs(&local_280,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_398);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_398);
  lVar4 = -0xa0;
  plVar7 = local_298;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -5;
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0);
  paVar1 = &local_320.first.field_2;
  local_320.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,
             "-okaylog-bool -nookaylog-negbool -okaylog=public -dontlog=private42","");
  ResetArgs(&local_280,&local_320.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_320.first._M_dataplus._M_p,
                    CONCAT71(local_320.first.field_2._M_allocated_capacity._1_7_,
                             local_320.first.field_2._M_local_buf[0]) + 1);
  }
  local_320.first._M_string_length = 0;
  local_320.first.field_2._M_local_buf[0] = '\0';
  local_320.first._M_dataplus._M_p = (pointer)paVar1;
  pLVar2 = LogInstance();
  local_338 = 0;
  local_328 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp:441:9)>
              ::_M_invoke;
  local_330 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp:441:9)>
              ::_M_manager;
  fun.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffb7c;
  fun.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffb78;
  fun.super__Function_base._M_functor._8_8_ = (undefined8)_cVar8;
  fun.super__Function_base._M_manager = in_stack_fffffffffffffb88;
  fun._M_invoker = in_stack_fffffffffffffb90;
  local_340 = &local_320;
  it = BCLog::Logger::PushBackCallback(pLVar2,fun);
  if (local_330 != (code *)0x0) {
    (*local_330)(&local_340,&local_340,3);
  }
  ArgsManager::LogArgs(&local_280);
  pLVar2 = LogInstance();
  BCLog::Logger::DeleteCallback(pLVar2,it);
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1c2;
  file.m_begin = (iterator)&local_350;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_360,msg);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&local_320.first,"Command-line arg: okaylog-bool=\"\"",0,0x21);
  local_378.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar3 != 0xffffffffffffffff);
  local_378.m_message.px = (element_type *)0x0;
  local_378.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3a8 = "str.find(\"Command-line arg: okaylog-bool=\\\"\\\"\") != std::string::npos";
  local_3a0 = "";
  local_398[8] = false;
  local_398._0_8_ = &PTR__lazy_ostream_01389048;
  local_388 = boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3b0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_380 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_378,(lazy_ostream *)local_398,1,0,WARN,_cVar8,(size_t)&local_3b8,0x1c2);
  boost::detail::shared_count::~shared_count(&local_378.m_message.pn);
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1c3;
  file_00.m_begin = (iterator)&local_3c8;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3d8,
             msg_00);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&local_320.first,"Command-line arg: okaylog-negbool=false",0,0x27);
  local_378.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar3 != 0xffffffffffffffff);
  local_378.m_message.px = (element_type *)0x0;
  local_378.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3a8 = "str.find(\"Command-line arg: okaylog-negbool=false\") != std::string::npos";
  local_3a0 = "";
  local_398[8] = false;
  local_398._0_8_ = &PTR__lazy_ostream_01389048;
  local_388 = boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3e0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_380 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_378,(lazy_ostream *)local_398,1,0,WARN,_cVar8,(size_t)&local_3e8,0x1c3);
  boost::detail::shared_count::~shared_count(&local_378.m_message.pn);
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1c4;
  file_01.m_begin = (iterator)&local_3f8;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_408,
             msg_01);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&local_320.first,"Command-line arg: okaylog=\"public\"",0,0x22);
  local_378.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar3 != 0xffffffffffffffff);
  local_378.m_message.px = (element_type *)0x0;
  local_378.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3a8 = "str.find(\"Command-line arg: okaylog=\\\"public\\\"\") != std::string::npos";
  local_3a0 = "";
  local_398[8] = false;
  local_398._0_8_ = &PTR__lazy_ostream_01389048;
  local_388 = boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_410 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_380 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_378,(lazy_ostream *)local_398,1,0,WARN,_cVar8,(size_t)&local_418,0x1c4);
  boost::detail::shared_count::~shared_count(&local_378.m_message.pn);
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1c5;
  file_02.m_begin = (iterator)&local_428;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_438,
             msg_02);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&local_320.first,"dontlog=****",0,0xc);
  local_378.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar3 != 0xffffffffffffffff);
  local_378.m_message.px = (element_type *)0x0;
  local_378.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3a8 = "str.find(\"dontlog=****\") != std::string::npos";
  local_3a0 = "";
  local_398[8] = false;
  local_398._0_8_ = &PTR__lazy_ostream_01389048;
  local_388 = boost::unit_test::lazy_ostream::inst;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_440 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_380 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_378,(lazy_ostream *)local_398,1,0,WARN,_cVar8,(size_t)&local_448,0x1c5);
  boost::detail::shared_count::~shared_count(&local_378.m_message.pn);
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1c6;
  file_03.m_begin = (iterator)&local_458;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_468,
             msg_03);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&local_320.first,"private42",0,9);
  local_378.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar3 == 0xffffffffffffffff);
  local_378.m_message.px = (element_type *)0x0;
  local_378.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3a8 = "str.find(\"private42\") == std::string::npos";
  local_3a0 = "";
  local_398[8] = false;
  local_398._0_8_ = &PTR__lazy_ostream_01389048;
  local_388 = boost::unit_test::lazy_ostream::inst;
  local_380 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_378,(lazy_ostream *)local_398,1,0,WARN,_cVar8,(size_t)&stack0xfffffffffffffb88,
             0x1c6);
  boost::detail::shared_count::~shared_count(&local_378.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.first._M_dataplus._M_p != &local_320.first.field_2) {
    operator_delete(local_320.first._M_dataplus._M_p,
                    CONCAT71(local_320.first.field_2._M_allocated_capacity._1_7_,
                             local_320.first.field_2._M_local_buf[0]) + 1);
  }
  ArgsManager::~ArgsManager(&local_280);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(logargs)
{
    ArgsManager local_args;

    const auto okaylog_bool = std::make_pair("-okaylog-bool", ArgsManager::ALLOW_ANY);
    const auto okaylog_negbool = std::make_pair("-okaylog-negbool", ArgsManager::ALLOW_ANY);
    const auto okaylog = std::make_pair("-okaylog", ArgsManager::ALLOW_ANY);
    const auto dontlog = std::make_pair("-dontlog", ArgsManager::ALLOW_ANY | ArgsManager::SENSITIVE);
    SetupArgs(local_args, {okaylog_bool, okaylog_negbool, okaylog, dontlog});
    ResetArgs(local_args, "-okaylog-bool -nookaylog-negbool -okaylog=public -dontlog=private42");

    // Everything logged to debug.log will also append to str
    std::string str;
    auto print_connection = LogInstance().PushBackCallback(
        [&str](const std::string& s) {
            str += s;
        });

    // Log the arguments
    local_args.LogArgs();

    LogInstance().DeleteCallback(print_connection);
    // Check that what should appear does, and what shouldn't doesn't.
    BOOST_CHECK(str.find("Command-line arg: okaylog-bool=\"\"") != std::string::npos);
    BOOST_CHECK(str.find("Command-line arg: okaylog-negbool=false") != std::string::npos);
    BOOST_CHECK(str.find("Command-line arg: okaylog=\"public\"") != std::string::npos);
    BOOST_CHECK(str.find("dontlog=****") != std::string::npos);
    BOOST_CHECK(str.find("private42") == std::string::npos);
}